

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemUtils.h
# Opt level: O2

void __thiscall FileSystemUtils::Path::ReplaceExtension(Path *this,string *ext)

{
  string *psVar1;
  ulong uVar2;
  pointer pcVar3;
  bool bVar4;
  ulong uVar5;
  
  bVar4 = HasExtension(this);
  if (bVar4) {
    psVar1 = &this->m_string;
    uVar5 = std::__cxx11::string::rfind((char)psVar1,0x2e);
    uVar2 = (this->m_string)._M_string_length;
    if (uVar5 < uVar2) {
      pcVar3 = (psVar1->_M_dataplus)._M_p;
      std::__cxx11::string::erase(psVar1,pcVar3 + uVar5,pcVar3 + uVar2);
    }
  }
  std::__cxx11::string::append((string *)&this->m_string);
  return;
}

Assistant:

inline void Path::ReplaceExtension( const std::string& ext )
	{
		if( HasExtension() )
		{
			size_t pos = m_string.find_last_of( '.' );
			if( pos < m_string.length() )
			{
				m_string.erase( m_string.begin() + pos, m_string.end() );
			}
		}
		m_string += ext;
	}